

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void redisAsyncDisconnect(redisAsyncContext *ac)

{
  redisContext *c;
  redisAsyncContext *ac_local;
  
  (ac->c).flags = (ac->c).flags | 4;
  (ac->c).flags = (ac->c).flags & 0xfffffdff;
  if ((((ac->c).flags & 0x10U) == 0) && ((ac->replies).head == (redisCallback *)0x0)) {
    __redisAsyncDisconnect(ac);
  }
  return;
}

Assistant:

void redisAsyncDisconnect(redisAsyncContext *ac) {
    redisContext *c = &(ac->c);
    c->flags |= REDIS_DISCONNECTING;

    /** unset the auto-free flag here, because disconnect undoes this */
    c->flags &= ~REDIS_NO_AUTO_FREE;
    if (!(c->flags & REDIS_IN_CALLBACK) && ac->replies.head == NULL)
        __redisAsyncDisconnect(ac);
}